

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS
ref_metric_gradation_at_complexity
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL gradation,REF_DBL complexity)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_GLOB *pRVar3;
  double dVar4;
  uint uVar5;
  REF_DBL *pRVar6;
  undefined8 uVar7;
  long lVar8;
  REF_STATUS RVar9;
  ulong uVar10;
  char *pcVar11;
  int iVar12;
  long lVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  REF_DBL current_complexity;
  double local_98;
  ulong local_90;
  REF_DBL local_88;
  double local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  REF_DBL local_68;
  REF_DBL *local_50;
  double local_48;
  
  pRVar2 = ref_grid->node;
  local_80 = *(double *)(&DAT_0020f9b0 + (ulong)(ref_grid->twod == 0) * 8);
  local_48 = complexity;
  if (complexity <= -complexity) {
    local_48 = -complexity;
  }
  local_50 = metric + 4;
  uVar10 = 0;
  local_78 = 0;
  uStack_74 = 0;
  uStack_70 = 0;
  uStack_6c = 0x3ff00000;
  local_88 = gradation;
  local_68 = complexity;
  do {
    uVar5 = ref_metric_complexity(metric,ref_grid,&local_98);
    if (uVar5 != 0) {
      uVar10 = (ulong)uVar5;
      pcVar11 = "cmp";
      uVar7 = 0x43b;
      goto LAB_001b9602;
    }
    dVar4 = local_98 * 1e+20;
    if (dVar4 <= -dVar4) {
      dVar4 = -dVar4;
    }
    if (dVar4 <= local_48) {
      if (ref_grid->mpi->id != 0) {
        return 4;
      }
      printf("div zero target %.18e current %.18e\n",local_68._0_4_);
      return 4;
    }
    uVar14 = SUB84(local_88,0);
    uVar15 = (undefined4)((ulong)local_88 >> 0x20);
    local_90 = uVar10;
    if (0 < pRVar2->max) {
      lVar13 = 0;
      pRVar6 = metric;
      do {
        if (-1 < pRVar2->global[lVar13]) {
          lVar8 = 0;
          do {
            dVar4 = pow(local_68 / local_98,local_80);
            pRVar6[lVar8] = dVar4 * pRVar6[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 6);
          uVar14 = SUB84(local_88,0);
          uVar15 = (undefined4)((ulong)local_88 >> 0x20);
          if (ref_grid->twod != 0) {
            metric[lVar13 * 6 + 2] = 0.0;
            metric[lVar13 * 6 + 4] = (REF_DBL)CONCAT44(uStack_74,local_78);
            (metric + lVar13 * 6 + 4)[1] = (REF_DBL)CONCAT44(uStack_6c,uStack_70);
          }
        }
        lVar13 = lVar13 + 1;
        pRVar6 = pRVar6 + 6;
      } while (lVar13 < pRVar2->max);
    }
    if (1.0 < (double)CONCAT44(uVar15,uVar14) || (double)CONCAT44(uVar15,uVar14) == 1.0) {
      uVar5 = ref_metric_metric_space_gradation(metric,ref_grid,(REF_DBL)CONCAT44(uVar15,uVar14));
      iVar12 = (int)local_90;
      if (uVar5 != 0) {
        uVar10 = (ulong)uVar5;
        pcVar11 = "gradation";
        uVar7 = 0x452;
        goto LAB_001b9602;
      }
    }
    else {
      uVar5 = ref_metric_mixed_space_gradation(metric,ref_grid,-1.0,-1.0);
      iVar12 = (int)local_90;
      if (uVar5 != 0) {
        uVar10 = (ulong)uVar5;
        pcVar11 = "gradation";
        uVar7 = 0x44f;
        goto LAB_001b9602;
      }
    }
    if ((ref_grid->twod != 0) && (iVar1 = pRVar2->max, 0 < (long)iVar1)) {
      pRVar3 = pRVar2->global;
      lVar13 = 0;
      pRVar6 = local_50;
      do {
        if (-1 < pRVar3[lVar13]) {
          pRVar6[-2] = 0.0;
          *pRVar6 = (REF_DBL)CONCAT44(uStack_74,local_78);
          pRVar6[1] = (REF_DBL)CONCAT44(uStack_6c,uStack_70);
        }
        lVar13 = lVar13 + 1;
        pRVar6 = pRVar6 + 6;
      } while (iVar1 != lVar13);
    }
    uVar10 = (ulong)(iVar12 + 1U);
  } while (iVar12 + 1U != 0x14);
  uVar5 = ref_metric_complexity(metric,ref_grid,&local_98);
  if (uVar5 == 0) {
    dVar4 = local_98 * 1e+20;
    if (dVar4 <= -dVar4) {
      dVar4 = -dVar4;
    }
    RVar9 = 4;
    if (local_48 < dVar4) {
      if (pRVar2->max < 1) {
        RVar9 = 0;
      }
      else {
        lVar13 = 0;
        local_78 = 0;
        uStack_74 = 0;
        uStack_70 = 0;
        uStack_6c = 0x3ff00000;
        pRVar6 = metric;
        do {
          if (-1 < pRVar2->global[lVar13]) {
            lVar8 = 0;
            do {
              dVar4 = pow(local_68 / local_98,local_80);
              pRVar6[lVar8] = dVar4 * pRVar6[lVar8];
              lVar8 = lVar8 + 1;
            } while (lVar8 != 6);
            if (ref_grid->twod != 0) {
              metric[lVar13 * 6 + 2] = 0.0;
              metric[lVar13 * 6 + 4] = (REF_DBL)CONCAT44(uStack_74,local_78);
              (metric + lVar13 * 6 + 4)[1] = (REF_DBL)CONCAT44(uStack_6c,uStack_70);
            }
          }
          lVar13 = lVar13 + 1;
          pRVar6 = pRVar6 + 6;
          RVar9 = 0;
        } while (lVar13 < pRVar2->max);
      }
    }
  }
  else {
    uVar10 = (ulong)uVar5;
    pcVar11 = "cmp";
    uVar7 = 0x45c;
LAB_001b9602:
    RVar9 = (REF_STATUS)uVar10;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar7,
           "ref_metric_gradation_at_complexity",uVar10,pcVar11);
  }
  return RVar9;
}

Assistant:

REF_FCN REF_STATUS ref_metric_gradation_at_complexity(REF_DBL *metric,
                                                      REF_GRID ref_grid,
                                                      REF_DBL gradation,
                                                      REF_DBL complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT relaxations;
  REF_DBL current_complexity;
  REF_DBL complexity_scale;
  REF_INT node, i;

  complexity_scale = 2.0 / 3.0;
  if (ref_grid_twod(ref_grid)) {
    complexity_scale = 1.0;
  }

  for (relaxations = 0; relaxations < 20; relaxations++) {
    RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
    if (!ref_math_divisible(complexity, current_complexity)) {
      if (ref_mpi_once(ref_grid_mpi(ref_grid)))
        printf("div zero target %.18e current %.18e\n", complexity,
               current_complexity);
      return REF_DIV_ZERO;
    }
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 6; i++) {
        metric[i + 6 * node] *=
            pow(complexity / current_complexity, complexity_scale);
      }
      if (ref_grid_twod(ref_grid)) {
        metric[2 + 6 * node] = 0.0;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0;
      }
    }
    if (gradation < 1.0) {
      RSS(ref_metric_mixed_space_gradation(metric, ref_grid, -1.0, -1.0),
          "gradation");
    } else {
      RSS(ref_metric_metric_space_gradation(metric, ref_grid, gradation),
          "gradation");
    }
    if (ref_grid_twod(ref_grid)) {
      each_ref_node_valid_node(ref_node, node) {
        metric[2 + 6 * node] = 0.0;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0;
      }
    }
  }
  RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
  if (!ref_math_divisible(complexity, current_complexity)) {
    return REF_DIV_ZERO;
  }
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(complexity / current_complexity, complexity_scale);
    }
    if (ref_grid_twod(ref_grid)) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  return REF_SUCCESS;
}